

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void initialize_buffer_pool(DECODER_MODEL *decoder_model)

{
  DECODER_MODEL *in_RDI;
  int i_1;
  int i;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < 10; local_c = local_c + 1) {
    release_buffer(in_RDI,local_c);
  }
  for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
    in_RDI->vbi[local_10] = -1;
  }
  return;
}

Assistant:

static void initialize_buffer_pool(DECODER_MODEL *const decoder_model) {
  for (int i = 0; i < BUFFER_POOL_MAX_SIZE; ++i) {
    release_buffer(decoder_model, i);
  }
  for (int i = 0; i < REF_FRAMES; ++i) {
    decoder_model->vbi[i] = -1;
  }
}